

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

ch_primitive ch_vm_call(ch_context *context,ch_string *function_name)

{
  ch_stack *stack;
  uint8_t uVar1;
  byte bVar2;
  ch_dataptr function_ptr;
  uint8_t *puVar3;
  byte *pbVar4;
  ch_jmpptr offset;
  size_t sVar5;
  undefined4 uVar6;
  ch_primitive_type cVar7;
  _Bool _Var8;
  ch_string *pcVar9;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar10;
  ch_primitive *pcVar11;
  ch_upvalue *pcVar12;
  ch_argcount argcount;
  ch_primitive *pcVar13;
  ch_upvalue **ppcVar14;
  char *pcVar15;
  char *error;
  ch_stack_addr index;
  ch_exit exit;
  ch_upvalue *pcVar16;
  ch_upvalue *pcVar17;
  ulong uVar18;
  ch_primitive cVar19;
  ch_primitive value_00;
  ch_primitive value_01;
  ch_primitive entry;
  ch_primitive primitive;
  ch_primitive entry_00;
  ch_primitive value_02;
  ch_primitive entry_01;
  ch_primitive value_03;
  ch_primitive args [2];
  double value;
  ch_primitive local_88;
  ch_primitive local_78;
  ch_call_stack *local_68;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_60;
  ch_table *local_58;
  ch_primitive *local_50;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_48;
  ch_string *local_40;
  ch_upvalue **local_38;
  
  stack = &context->stack;
  sVar5 = (context->stack).size;
  local_50 = &context->program_return_value;
  local_68 = &context->call_stack;
  local_38 = &context->open_upvalues;
  local_58 = &context->globals;
  local_40 = function_name;
LAB_00103150:
  if (context->exit != RUNNING) {
    if (context->exit == EXIT_OK) {
      puts("Program has halted.");
    }
    else {
      printf("Runtime error: %d.\n");
    }
    cVar19._4_4_ = 0;
    cVar19.type = (context->program_return_value).type;
    cVar19.field_1 =
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (context->program_return_value).field_1.object_value;
    return cVar19;
  }
  puVar3 = context->pcurrent;
  uVar1 = *puVar3;
  context->pcurrent = puVar3 + 1;
  switch(uVar1) {
  case '\0':
    context->exit = EXIT_OK;
    goto LAB_00103150;
  case '\x01':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) goto LAB_00103150;
    break;
  case '\x02':
    context->pcurrent = puVar3 + 5;
    ch_stack_popn(stack,puVar3[1]);
    goto LAB_00103150;
  case '\x03':
    index = (int)(context->stack).size - 1;
    goto LAB_0010341a;
  case '\x04':
    context->pcurrent = puVar3 + 5;
    aVar10 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)
             ((anon_union_8_4_dd993ae3_for_ch_primitive_1 *)
             (context->pstart + *(uint *)(puVar3 + 1)))->object_value;
LAB_00103838:
    uVar18 = 0;
    goto LAB_0010383d;
  case '\x05':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      value_00._4_4_ = 0;
      value_00.type = local_88.type;
      value_00.field_1.number_value = local_88.field_1.number_value;
      _Var8 = ch_checknumber(context,value_00,&local_60.number_value);
      if (_Var8) {
        aVar10.number_value = local_60.number_value ^ 0x8000000000000000;
        goto LAB_00103838;
      }
      goto LAB_00103150;
    }
    break;
  case '\x06':
  case '\b':
  case '\n':
  case '\v':
    ch_stack_pop(stack,&local_88);
    ch_stack_pop(stack,&local_78);
    if (local_88.type != local_78.type) {
      pcVar15 = "Can only apply binary operator on matching types.";
LAB_001038e7:
      exit = EXIT_INCORRECT_TYPE;
      goto LAB_001038ef;
    }
    if (local_88.type == PRIMITIVE_OBJECT) {
      if ((local_88.field_1.object_value)->type !=
          ((ch_object *)&(local_78.field_1.object_value)->type)->type) {
        pcVar15 = "Can only apply binary operator on matching object types.";
        goto LAB_001038e7;
      }
      if ((local_88.field_1.object_value)->type == TYPE_STRING) {
        if (uVar1 == '\x06') {
          aVar10.number_value =
               (double)ch_concatstring(context,local_78.field_1.number_value,
                                       local_88.field_1.number_value);
          uVar18 = 3;
          local_60.object_value = aVar10.object_value;
        }
        else {
          ch_runtime_error(context,EXIT_UNSUPPORTED_OPERATION,"Can only use + operator on strings.")
          ;
          local_60.number_value = 0.0;
          uVar18 = 2;
          aVar10.number_value = local_60.number_value;
        }
        goto LAB_0010383d;
      }
      pcVar15 = "Cannot apply binary operation to object type: %d";
    }
    else {
      if (local_88.type == PRIMITIVE_NUMBER) {
        switch(uVar1) {
        case '\x06':
          aVar10.number_value = local_88.field_1.number_value + local_78.field_1.number_value;
          break;
        default:
          ch_runtime_error(context,EXIT_UNKNOWN_INSTRUCTION,"Unsupported instruction for binary op."
                          );
          aVar10.number_value = 0.0;
          break;
        case '\b':
          aVar10.number_value = local_88.field_1.number_value - local_78.field_1.number_value;
          break;
        case '\n':
          aVar10.number_value = local_88.field_1.number_value * local_78.field_1.number_value;
          break;
        case '\v':
          aVar10.number_value = local_88.field_1.number_value / local_78.field_1.number_value;
        }
        goto LAB_00103838;
      }
      pcVar15 = "Cannot apply binary operation to primitive type: %d";
    }
    ch_runtime_error(context,EXIT_INCORRECT_TYPE,pcVar15);
    goto LAB_00103150;
  case '\a':
  case '\t':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      if (local_88.type != PRIMITIVE_NUMBER) {
        pcVar15 = "Expected number for addone, subone op";
        goto LAB_001038e7;
      }
      aVar10.number_value =
           *(double *)(&DAT_001042f0 + (ulong)(uVar1 == '\a') * 8) + local_88.field_1.number_value;
      goto LAB_00103838;
    }
    break;
  case '\f':
    aVar10.object_value = &read_string(context)->object;
    goto LAB_001033e9;
  case '\r':
    uVar18 = 1;
    goto LAB_00103533;
  case '\x0e':
    uVar18 = 1;
    aVar10.number_value = 4.94065645841247e-324;
    goto LAB_0010383d;
  case '\x0f':
    context->pcurrent = puVar3 + 2;
    aVar10._1_7_ = 0;
    aVar10.boolean_value = (_Bool)puVar3[1];
    uVar18 = 4;
    goto LAB_0010383d;
  case '\x10':
    uVar18 = 2;
LAB_00103533:
    aVar10.number_value = 0.0;
    goto LAB_0010383d;
  case '\x11':
    context->pcurrent = puVar3 + 5;
    index = (uint)puVar3[1] + local_68->calls[(context->call_stack).size - 1].stack_addr;
LAB_0010341a:
    ch_stack_copy(stack,index);
    goto LAB_00103150;
  case '\x12':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      pbVar4 = context->pcurrent;
      context->pcurrent = pbVar4 + 4;
      entry_01._4_4_ = 0;
      entry_01.type = local_88.type;
      entry_01.field_1.number_value = local_88.field_1.number_value;
      ch_stack_set(stack,(uint)*pbVar4 + local_68->calls[(context->call_stack).size - 1].stack_addr,
                   entry_01);
      goto LAB_00103150;
    }
    break;
  case '\x13':
    context->pcurrent = puVar3 + 2;
    pcVar11 = (local_68->calls[(context->call_stack).size - 1].closure)->upvalues[puVar3[1]]->value;
    uVar18 = (ulong)pcVar11->type;
    aVar10 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)(pcVar11->field_1).object_value;
    goto LAB_0010383d;
  case '\x14':
    context->pcurrent = puVar3 + 2;
    bVar2 = puVar3[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      pcVar11 = (local_68->calls[(context->call_stack).size - 1].closure)->upvalues[bVar2]->value;
      *(ulong *)pcVar11 = CONCAT44(local_88._4_4_,local_88.type);
      (pcVar11->field_1).number_value = (double)local_88.field_1;
      goto LAB_00103150;
    }
    break;
  case '\x15':
    pcVar11 = ch_stack_get(stack,(int)(context->stack).size - 1);
    pcVar12 = context->open_upvalues;
    while ((pcVar12 != (ch_upvalue *)0x0 && (pcVar13 = pcVar12->value, pcVar11 <= pcVar13))) {
      uVar6 = *(undefined4 *)&pcVar13->field_0x4;
      aVar10 = pcVar13->field_1;
      (pcVar12->closed).type = pcVar13->type;
      *(undefined4 *)&(pcVar12->closed).field_0x4 = uVar6;
      (pcVar12->closed).field_1 = aVar10;
      pcVar12->value = &pcVar12->closed;
      pcVar12 = pcVar12->next;
      context->open_upvalues = pcVar12;
    }
    ch_stack_popn(stack,'\x01');
    goto LAB_00103150;
  case '\x16':
  case '\x17':
    pcVar9 = read_string(context);
    _Var8 = ch_stack_pop(stack,&local_88);
    aVar10 = local_88.field_1;
    cVar7 = local_88.type;
    if (_Var8) {
      value_03._4_4_ = 0;
      value_03.type = local_88.type;
      pcVar11 = ch_table_get(local_58,pcVar9);
      if (uVar1 == '\x16') {
        if (pcVar11 != (ch_primitive *)0x0) {
          pcVar11->type = cVar7;
          (pcVar11->field_1).number_value = (double)aVar10;
          goto LAB_00103150;
        }
        pcVar15 = pcVar9->value;
        error = "Cannot assign to non existing global variable: %s.";
      }
      else {
        if (pcVar11 == (ch_primitive *)0x0) {
          value_03.field_1.number_value = aVar10.number_value;
          ch_table_set(local_58,pcVar9,value_03);
          goto LAB_00103150;
        }
        pcVar15 = pcVar9->value;
        error = "Cannot redefine global variable: %s.";
      }
      ch_runtime_error(context,EXIT_GLOBAL_NOT_FOUND,error,pcVar15);
      goto LAB_00103150;
    }
    break;
  case '\x18':
    pcVar9 = read_string(context);
    get_global(context,pcVar9);
    goto LAB_00103150;
  case '\x19':
    get_global(context,local_40);
    _Var8 = ch_stack_pop(stack,&local_88);
    argcount = (ch_argcount)sVar5;
    if (_Var8) {
LAB_001037ce:
      primitive._4_4_ = 0;
      primitive.type = local_88.type;
      primitive.field_1.number_value = local_88.field_1.number_value;
      try_call(context,primitive,argcount);
      goto LAB_00103150;
    }
    break;
  case '\x1a':
    context->pcurrent = puVar3 + 2;
    argcount = puVar3[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) goto LAB_001037ce;
    break;
  case '\x1b':
    call_return(context);
    goto LAB_00103150;
  case '\x1c':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      call_return(context);
      if ((context->call_stack).size != 0) {
        uVar18 = (ulong)local_88.type;
        aVar10 = local_88.field_1;
        goto LAB_0010383d;
      }
      *(ulong *)local_50 = CONCAT44(local_88._4_4_,local_88.type);
      (local_50->field_1).number_value = (double)local_88.field_1;
      goto LAB_00103150;
    }
    break;
  case '\x1d':
    context->pcurrent = puVar3 + 5;
    offset = *(ch_jmpptr *)(puVar3 + 1);
    cVar19 = ch_stack_peek(stack,0);
    value_02._4_4_ = 0;
    value_02.type = cVar19.type;
    value_02.field_1.number_value = cVar19.field_1.number_value;
    _Var8 = ch_primitive_isfalsy(value_02);
    if (_Var8) {
      jump(context,offset);
    }
    goto LAB_00103150;
  case '\x1e':
    context->pcurrent = puVar3 + 5;
    jump(context,*(ch_jmpptr *)(puVar3 + 1));
    goto LAB_00103150;
  case '\x1f':
    context->pcurrent = puVar3 + 5;
    function_ptr = *(ch_dataptr *)(puVar3 + 1);
    context->pcurrent = puVar3 + 6;
    aVar10.object_value = &ch_loadfunction(function_ptr,puVar3[5])->object;
LAB_001033e9:
    uVar18 = 3;
LAB_0010383d:
    entry_00.field_1.object_value = aVar10.object_value;
    entry_00._0_8_ = uVar18;
    _Var8 = ch_stack_push(stack,entry_00);
    if (!_Var8) goto LAB_0010384a;
    goto LAB_00103150;
  case ' ':
    context->pcurrent = puVar3 + 2;
    bVar2 = puVar3[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (!_Var8) break;
    local_60.number_value = 0.0;
    value_01._4_4_ = 0;
    value_01.type = local_88.type;
    value_01.field_1.number_value = local_88.field_1.number_value;
    _Var8 = ch_checkfunction(context,value_01,(ch_function **)&local_60.object_value);
    if (_Var8) {
      local_48.number_value = (double)ch_loadclosure(local_60.number_value,bVar2);
      entry.field_1.object_value = local_48.object_value;
      entry._0_8_ = 3;
      _Var8 = ch_stack_push(stack,entry);
      if (_Var8) {
        if ((ulong)bVar2 != 0) {
          uVar18 = 0;
          do {
            puVar3 = context->pcurrent;
            context->pcurrent = puVar3 + 1;
            uVar1 = *puVar3;
            context->pcurrent = puVar3 + 2;
            if (uVar1 == '\0') {
              pcVar12 = (local_68->calls[(context->call_stack).size - 1].closure)->upvalues
                        [puVar3[1]];
            }
            else {
              pcVar11 = ch_stack_get(stack,(uint)puVar3[1] +
                                           local_68->calls[(context->call_stack).size - 1].
                                           stack_addr);
              pcVar16 = context->open_upvalues;
              if (pcVar16 == (ch_upvalue *)0x0) {
                pcVar17 = (ch_upvalue *)0x0;
              }
              else {
                pcVar13 = pcVar16->value;
                if (pcVar11 < pcVar13) {
                  do {
                    pcVar17 = pcVar16;
                    pcVar12 = pcVar17->next;
                    pcVar16 = pcVar12;
                    if (pcVar12 == (ch_upvalue *)0x0) goto LAB_0010364d;
                    pcVar13 = pcVar12->value;
                  } while (pcVar11 < pcVar13);
                }
                else {
                  pcVar17 = (ch_upvalue *)0x0;
                  pcVar12 = pcVar16;
                }
                pcVar16 = pcVar12;
                if (pcVar13 == pcVar11) goto LAB_0010366c;
              }
LAB_0010364d:
              pcVar12 = ch_loadupvalue(pcVar11);
              pcVar12->next = pcVar16;
              ppcVar14 = &pcVar17->next;
              if (pcVar17 == (ch_upvalue *)0x0) {
                ppcVar14 = local_38;
              }
              *ppcVar14 = pcVar12;
            }
LAB_0010366c:
            (*(ch_upvalue ***)(local_48.object_value + 4))[uVar18] = pcVar12;
            uVar18 = uVar18 + 1;
          } while (uVar18 != bVar2);
        }
      }
      else {
LAB_0010384a:
        context->exit = EXIT_STACK_SIZE_EXCEEDED;
      }
    }
    goto LAB_00103150;
  default:
    exit = EXIT_UNKNOWN_INSTRUCTION;
    pcVar15 = "Unknown instruction.";
LAB_001038ef:
    ch_runtime_error(context,exit,pcVar15);
    goto LAB_00103150;
  }
  context->exit = EXIT_STACK_EMPTY;
  goto LAB_00103150;
}

Assistant:

ch_primitive ch_vm_call(ch_context *context, ch_string *function_name) {
  size_t initial_stack_size = context->stack.size;

  while (context->exit == RUNNING) {
    uint8_t opcode = *(context->pcurrent);
    context->pcurrent++;

    switch (opcode) {
    case OP_NUMBER: {
      double value = LOAD_NUMBER(context, VM_READ_PTR(context));
      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_STRING: {
      ch_string* string = read_string(context);
      STACK_PUSH(context, MAKE_OBJECT(string));
      break;
    }
    case OP_FALSE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(false));
      break;
    }
    case OP_TRUE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(true));
      break;
    }
    case OP_CHAR: {
      char value = VM_READ_CHAR(context);
      STACK_PUSH(context, MAKE_CHAR(value));
      break;
    }
    case OP_NULL: {
      STACK_PUSH(context, MAKE_NULL());
      break;
    }
    case OP_ADD: 
    case OP_SUB:
    case OP_MUL:
    case OP_DIV: {
      ch_primitive args[2];
      binary_op_args(context, args);

      if (args[0].type != args[1].type) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching types.");
        break;
      }

      ch_primitive result;
      if (IS_NUMBER(args[0])) {
        STACK_PUSH(context, binary_op_number(context, args, opcode));
        break;
      }

      if (IS_OBJECT(args[0])) {
        ch_object* object_args[2] = {AS_OBJECT(args[0]), AS_OBJECT(args[1])};
        if (object_args[0]->type != object_args[1]->type) {
          ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching object types.");
          break;
        }

        if (IS_STRING(object_args[0])) {
          STACK_PUSH(context, binary_op_string(context, object_args, opcode));
          break;
        }

        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to object type: %d", object_args[0]->type);
        break;
      }

      ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to primitive type: %d", args[0].type);
      break;
    }
    case OP_ADDONE:
    case OP_SUBONE: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      if (!IS_NUMBER(entry)) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Expected number for addone, subone op");
        break;
      }

      double value;
      if (opcode == OP_ADDONE) {
        value = AS_NUMBER(entry) + 1;
      } else {
        value = AS_NUMBER(entry) - 1;
      }

      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_NEGATE: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      double value;
      if(ch_checknumber(context, entry, &value)) {
        STACK_PUSH(context, MAKE_NUMBER(-value));
      }
      break;
    }
    case OP_HALT: {
      context->exit = EXIT_OK;
      break;
    }
    case OP_POP: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      break;
    }
    case OP_POPN: {
      ch_dataptr num_popped = VM_READ_PTR(context);

      // TODO add runtime check?
      ch_stack_popn(&context->stack, num_popped);
      break;
    }
    case OP_TOP: {
      ch_stack_copy(&context->stack, CH_STACK_ADDR(&context->stack) - 1);
      break;
    }
    case OP_LOAD_LOCAL: {
      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;
      ch_stack_copy(&context->stack, index);
      break;
    }
    case OP_SET_LOCAL: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;

      ch_stack_set(&context->stack, index, entry);
      break;
    }
    case OP_LOAD_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive* value = CURRENT_CALL(context).closure->upvalues[index]->value;
      STACK_PUSH(context, *value);
      break;
    }
    case OP_SET_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);

      *CURRENT_CALL(context).closure->upvalues[index]->value = value;
      break;
    }
    case OP_CLOSE_UPVALUE: {
      ch_primitive* closed = ch_stack_get(&context->stack, context->stack.size - 1);
      close_upvalues(context, closed);
      ch_stack_popn(&context->stack, 1);
      break;
    }
    case OP_DEFINE_GLOBAL:
    case OP_SET_GLOBAL: {
      ch_string *name = read_string(context);

      ch_primitive entry;
      STACK_POP(context, &entry);

      set_global(context, name, entry, opcode == OP_SET_GLOBAL ? REDEFINE_GLOBAL : CREATE_GLOBAL);

      break;
    }
    case OP_LOAD_GLOBAL: {
      ch_string *name = read_string(context);
      get_global(context, name);
      break;
    }
    case OP_FUNCTION: {
      ch_dataptr function_ptr = VM_READ_PTR(context);
      ch_argcount argcount = VM_READ_ARGCOUNT(context);
      ch_primitive function =
          MAKE_OBJECT(ch_loadfunction(function_ptr, argcount));
      STACK_PUSH(context, function);
      break;
    }
    case OP_CLOSURE: {
      uint8_t upvalue_count = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);
      ch_function* function = NULL;
      if(!ch_checkfunction(context, value, &function)) break;

      ch_closure* closure = ch_loadclosure(function, upvalue_count);
      STACK_PUSH(context, MAKE_OBJECT(closure));

      for(uint8_t i = 0; i < upvalue_count; i++) {
        uint8_t is_local = VM_READ_ARGCOUNT(context);
        uint8_t index = VM_READ_ARGCOUNT(context);

        if (is_local) {
          ch_stack_addr addr = CURRENT_CALL(context).stack_addr + index;
          closure->upvalues[i] = capture_upvalue(context, ch_stack_get(&context->stack, addr));
        } else {
          closure->upvalues[i] = CURRENT_CALL(context).closure->upvalues[index];
        }
      }
      break;
    }
    case OP_BEGIN: {
      get_global(context, function_name);
      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, initial_stack_size);
      break;
    }
    case OP_CALL: {
      ch_argcount argcount = VM_READ_ARGCOUNT(context);

      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, argcount);
      break;
    }
    case OP_RETURN_VALUE: {
      ch_primitive returned_value;
      STACK_POP(context, &returned_value);

      call_return(context);

      // Check if we are returning from the main function
      if (context->call_stack.size != 0) {
        STACK_PUSH(context, returned_value);
      } else {
        context->program_return_value = returned_value;
      }

      break;
    }
    case OP_RETURN_VOID: {
      call_return(context);
      break;
    }
    case OP_JMP: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);
      jump(context, ptr);
      break;
    }
    case OP_JMP_FALSE: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);

      ch_primitive peek = ch_stack_peek(&context->stack, 0);

      if (ch_primitive_isfalsy(peek)) {
        jump(context, ptr);
      }
      break;
    }
    default: {
      ch_runtime_error(context, EXIT_UNKNOWN_INSTRUCTION,
                       "Unknown instruction.");
      break;
    }
    }
  }

  if (context->exit != EXIT_OK) {
    printf("Runtime error: %d.\n", context->exit);
  } else {
    printf("Program has halted.\n");
  }

  return context->program_return_value;
}